

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

bool __thiscall GraphBuilder::matchLocksAndUnlocks(GraphBuilder *this)

{
  bool bVar1;
  reference ppVar2;
  const_iterator *pcVar3;
  Value *in_RDI;
  undefined1 auVar4 [16];
  pair<std::_Rb_tree_const_iterator<dg::pta::PSNode_*>,_bool> pVar5;
  Pointer unlockPointsTo;
  const_iterator __end4;
  const_iterator __begin4;
  PointsToSetT *__range4;
  Pointer lockPointsTo;
  const_iterator __end3;
  const_iterator __begin3;
  PointsToSetT *__range3;
  set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
  mutexPointerIntersection;
  PSNode *unlockMutexPtr;
  pair<const_llvm::CallInst_*const,_UnlockNode_*> unlock;
  iterator __end2;
  iterator __begin2;
  unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
  *__range2;
  PSNode *lockMutexPtr;
  pair<const_llvm::CallInst_*const,_LockNode_*> lock;
  iterator __end1;
  iterator __begin1;
  unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
  *__range1;
  bool changed;
  _Rb_tree_const_iterator<dg::pta::PSNode_*> in_stack_fffffffffffffec0;
  const_iterator *in_stack_fffffffffffffed0;
  UnlockNode *in_stack_fffffffffffffee0;
  LockNode *in_stack_fffffffffffffee8;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>,_false> local_58;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>,_false> local_50;
  Value *local_48;
  PSNode *local_40;
  CallInst *local_38;
  LockNode *local_30;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false> local_28;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false> local_20;
  Value *local_18;
  byte local_9;
  
  local_9 = 0;
  local_18 = in_RDI + 0x158;
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
       ::begin((unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
                *)in_RDI);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
       ::end((unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
              *)in_RDI);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false>::
             operator*((_Node_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false>
                        *)0x194126);
    local_38 = ppVar2->first;
    local_30 = ppVar2->second;
    local_40 = dg::DGLLVMPointerAnalysis::getPointsToNode
                         ((DGLLVMPointerAnalysis *)in_stack_fffffffffffffec0._M_node,in_RDI);
    local_48 = in_RDI + 400;
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
         ::begin((unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
                  *)in_RDI);
    local_58._M_cur =
         (__node_type *)
         std::
         unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
         ::end((unordered_map<const_llvm::CallInst_*,_UnlockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>_>_>
                *)in_RDI);
    while( true ) {
      bVar1 = std::__detail::operator!=(&local_50,&local_58);
      if (!bVar1) break;
      std::__detail::
      _Node_iterator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>,_false,_false>::operator*
                ((_Node_iterator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>,_false,_false>
                  *)0x1941c6);
      dg::DGLLVMPointerAnalysis::getPointsToNode
                ((DGLLVMPointerAnalysis *)in_stack_fffffffffffffec0._M_node,in_RDI);
      std::set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
      ::set((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
             *)0x194209);
      dg::pta::PointerIdPointsToSet::begin
                ((PointerIdPointsToSet *)in_stack_fffffffffffffec0._M_node);
      dg::pta::PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_fffffffffffffec0._M_node);
      while( true ) {
        bVar1 = dg::pta::PointerIdPointsToSet::const_iterator::operator!=
                          ((const_iterator *)in_stack_fffffffffffffec0._M_node,
                           (const_iterator *)in_RDI);
        if (!bVar1) break;
        pcVar3 = (const_iterator *)
                 dg::pta::PointerIdPointsToSet::const_iterator::operator*((const_iterator *)in_RDI);
        dg::pta::PointerIdPointsToSet::begin
                  ((PointerIdPointsToSet *)in_stack_fffffffffffffec0._M_node);
        dg::pta::PointerIdPointsToSet::end
                  ((PointerIdPointsToSet *)in_stack_fffffffffffffec0._M_node);
        while( true ) {
          bVar1 = dg::pta::PointerIdPointsToSet::const_iterator::operator!=
                            ((const_iterator *)in_stack_fffffffffffffec0._M_node,
                             (const_iterator *)in_RDI);
          if (!bVar1) break;
          auVar4 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                             ((const_iterator *)in_RDI);
          in_stack_fffffffffffffed0 = auVar4._0_8_;
          if (pcVar3 == in_stack_fffffffffffffed0) {
            pVar5 = std::
                    set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                    ::insert((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                              *)in_stack_fffffffffffffee0,auVar4._8_8_);
            in_stack_fffffffffffffec0 = pVar5.first._M_node;
          }
          dg::pta::PointerIdPointsToSet::const_iterator::operator++(in_stack_fffffffffffffed0);
        }
        dg::pta::PointerIdPointsToSet::const_iterator::operator++(in_stack_fffffffffffffed0);
      }
      bVar1 = std::
              set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
              ::empty((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
                       *)0x194328);
      if (!bVar1) {
        bVar1 = LockNode::addCorrespondingUnlock
                          (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
        local_9 = (local_9 & 1) != 0 || bVar1;
      }
      std::set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
      ::~set((set<dg::pta::PSNode_*,_std::less<dg::pta::PSNode_*>,_std::allocator<dg::pta::PSNode_*>_>
              *)0x194370);
      std::__detail::
      _Node_iterator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>,_false,_false>::operator++
                ((_Node_iterator<std::pair<const_llvm::CallInst_*const,_UnlockNode_*>,_false,_false>
                  *)in_stack_fffffffffffffec0._M_node);
    }
    std::__detail::_Node_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false> *
                 )in_stack_fffffffffffffec0._M_node);
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool GraphBuilder::matchLocksAndUnlocks() {
    using namespace dg::pta;
    bool changed = false;
    for (auto lock : llvmToLocks_) {
        auto *lockMutexPtr = pointsToAnalysis_->getPointsToNode(lock.first);
        for (auto unlock : llvmToUnlocks_) {
            auto *unlockMutexPtr =
                    pointsToAnalysis_->getPointsToNode(unlock.first);

            std::set<PSNode *> mutexPointerIntersection;
            for (const auto lockPointsTo : lockMutexPtr->pointsTo) {
                for (const auto unlockPointsTo : unlockMutexPtr->pointsTo) {
                    if (lockPointsTo.target == unlockPointsTo.target) {
                        mutexPointerIntersection.insert(lockPointsTo.target);
                    }
                }
            }

            if (!mutexPointerIntersection.empty()) {
                changed |= lock.second->addCorrespondingUnlock(unlock.second);
            }
        }
    }
    return changed;
}